

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MacroUsageSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroUsageSyntax,slang::syntax::MacroUsageSyntax_const&>
          (BumpAllocator *this,MacroUsageSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  MacroActualArgumentListSyntax *pMVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  MacroUsageSyntax *pMVar10;
  
  pMVar10 = (MacroUsageSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MacroUsageSyntax *)this->endPtr < pMVar10 + 1) {
    pMVar10 = (MacroUsageSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pMVar10 + 1);
  }
  SVar8 = (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->super_DirectiveSyntax).directive.kind;
  uVar5 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar6.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar7 = (args->super_DirectiveSyntax).directive.rawLen;
  pMVar3 = args->args;
  (pMVar10->super_DirectiveSyntax).directive.info = (args->super_DirectiveSyntax).directive.info;
  pMVar10->args = pMVar3;
  (pMVar10->super_DirectiveSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pMVar10->super_DirectiveSyntax).directive.kind = TVar4;
  (pMVar10->super_DirectiveSyntax).directive.field_0x2 = uVar5;
  (pMVar10->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar10->super_DirectiveSyntax).directive.rawLen = uVar7;
  (pMVar10->super_DirectiveSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pMVar10->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pMVar10->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  return pMVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }